

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMathExc.cpp
# Opt level: O2

void testMathExc(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"See if floating-point exceptions work:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"invalid operations / exception handling off");
  std::endl<char,std::char_traits<char>>(poVar1);
  Iex_3_4::mathExcOn(0);
  iVar2 = 3;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fVar4 = divide(1.0,0.0);
    anon_unknown.dwarf_1d81a::print(fVar4);
    fVar4 = root(-1.0);
    anon_unknown.dwarf_1d81a::print(fVar4);
    fVar4 = grow(1000.0,100);
    anon_unknown.dwarf_1d81a::print(fVar4);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"invalid operations / exception handling on");
  std::endl<char,std::char_traits<char>>(poVar1);
  Iex_3_4::mathExcOn(0x15);
  iVar2 = 3;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    fVar4 = divide(1.0,0.0);
    anon_unknown.dwarf_1d81a::print(fVar4);
    fVar4 = root(-1.0);
    anon_unknown.dwarf_1d81a::print(fVar4);
    fVar4 = grow(1000.0,100);
    anon_unknown.dwarf_1d81a::print(fVar4);
  }
  poVar1 = std::operator<<((ostream *)&std::cout," ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testMathExc ()
{
    std::cout << "See if floating-point exceptions work:" << std::endl;

    test1 ();
    test2 ();
    test3 ();

    std::cout << " ok" << std::endl;
}